

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

png_uint_32 random_32(void)

{
  png_uint_32 pVar1;
  byte local_c;
  byte local_b;
  byte local_a;
  byte local_9;
  png_uint_32 result;
  png_byte mark [4];
  
  do {
    store_pool_mark(&local_c);
    pVar1 = (uint)local_c * 0x1000000 + (uint)local_b * 0x10000 + (uint)local_a * 0x100 +
            (uint)local_9;
  } while (pVar1 == 0);
  return pVar1;
}

Assistant:

static png_uint_32
random_32(void)
{

   for (;;)
   {
      png_byte mark[4];
      png_uint_32 result;

      store_pool_mark(mark);
      result = png_get_uint_32(mark);

      if (result != 0)
         return result;
   }
}